

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::ClipperOffset::DoMiter(ClipperOffset *this,int j,int k,double r)

{
  pointer *ppIVar1;
  pointer pDVar2;
  pointer pIVar3;
  pointer pDVar4;
  iterator __position;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  IntPoint local_18;
  
  dVar7 = this->m_delta / r;
  pIVar3 = (this->m_srcPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar4 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar2 = pDVar4 + k;
  pDVar4 = pDVar4 + j;
  dVar8 = dVar7 * (pDVar4->X + pDVar2->X) + (double)pIVar3[j].X;
  dVar7 = dVar7 * (pDVar4->Y + pDVar2->Y) + (double)pIVar3[j].Y;
  uVar5 = -(ulong)(dVar8 < 0.0);
  uVar6 = -(ulong)(dVar7 < 0.0);
  local_18.X = (cInt)((double)(uVar5 & 0xbfe0000000000000 | ~uVar5 & 0x3fe0000000000000) + dVar8);
  local_18.Y = (cInt)((double)(uVar6 & 0xbfe0000000000000 | ~uVar6 & 0x3fe0000000000000) + dVar7);
  __position._M_current =
       (this->m_destPoly).
       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_destPoly).
      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
    _M_realloc_insert<ClipperLib::IntPoint>(&this->m_destPoly,__position,&local_18);
  }
  else {
    (__position._M_current)->X = local_18.X;
    (__position._M_current)->Y = local_18.Y;
    ppIVar1 = &(this->m_destPoly).
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
  }
  return;
}

Assistant:

void ClipperOffset::DoMiter(int j, int k, double r)
{
  double q = m_delta / r;
  m_destPoly.push_back(IntPoint(Round(m_srcPoly[j].X + (m_normals[k].X + m_normals[j].X) * q),
      Round(m_srcPoly[j].Y + (m_normals[k].Y + m_normals[j].Y) * q)));
}